

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::SliderBehavior
               (ImRect *frame_bb,ImGuiID id,float *v,float v_min,float v_max,float power,
               int decimal_precision,ImGuiSliderFlags flags)

{
  ImVec4 *pIVar1;
  float fVar2;
  float fVar3;
  ImVec2 p_min;
  ImVec2 p_max;
  ImGuiWindow *pIVar4;
  ImDrawList *this;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  ImGuiContext *pIVar9;
  ImGuiContext *pIVar10;
  ImU32 IVar11;
  ImVec2 *pIVar12;
  ImVec2 *pIVar13;
  ImRect *pIVar14;
  bool bVar15;
  ImGuiContext *g;
  uint uVar16;
  uint uVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  ImVec4 local_58;
  ImVec2 local_40;
  ImVec2 local_38;
  
  pIVar9 = GImGui;
  pIVar4 = GImGui->CurrentWindow;
  pIVar4->Accessed = true;
  p_min = frame_bb->Min;
  p_max = frame_bb->Max;
  local_58.x = (pIVar9->Style).Colors[7].x;
  local_58.y = (pIVar9->Style).Colors[7].y;
  uVar5 = (pIVar9->Style).Colors[7].z;
  uVar6 = (pIVar9->Style).Colors[7].w;
  local_58.w = (pIVar9->Style).Alpha * (float)uVar6;
  local_58.z = (float)uVar5;
  IVar11 = ColorConvertFloat4ToU32(&local_58);
  RenderFrame(p_min,p_max,IVar11,true,(pIVar9->Style).FrameRounding);
  uVar16 = flags & 1;
  pIVar12 = (ImVec2 *)&(frame_bb->Max).y;
  pIVar13 = pIVar12;
  if (uVar16 == 0) {
    pIVar13 = &frame_bb->Max;
  }
  fVar22 = (pIVar13->x - (&(frame_bb->Min).x)[uVar16]) + -4.0;
  if (decimal_precision == 0) {
    fVar21 = fVar22 / ((float)(~-(uint)(v_min < v_max) & (uint)(v_min - v_max) |
                              (uint)(v_max - v_min) & -(uint)(v_min < v_max)) + 1.0);
    fVar2 = (pIVar9->Style).GrabMinSize;
    uVar17 = -(uint)(fVar2 <= fVar21);
    fVar2 = (float)(~uVar17 & (uint)fVar2 | (uint)fVar21 & uVar17);
  }
  else {
    fVar2 = (pIVar9->Style).GrabMinSize;
  }
  if (fVar22 <= fVar2) {
    fVar2 = fVar22;
  }
  pIVar14 = (ImRect *)&(frame_bb->Min).y;
  if (uVar16 == 0) {
    pIVar14 = frame_bb;
  }
  fVar21 = (pIVar14->Min).x;
  if (uVar16 == 0) {
    pIVar12 = &frame_bb->Max;
  }
  fVar3 = pIVar12->x;
  if (0.0 <= v_min * v_max) {
    fVar18 = (float)(-(uint)(v_min < 0.0) & 0x3f800000);
  }
  else {
    fVar18 = powf(ABS(0.0 - v_min),1.0 / power);
    fVar19 = powf(ABS(v_max),1.0 / power);
    fVar18 = fVar18 / (fVar19 + fVar18);
  }
  pIVar10 = GImGui;
  fVar21 = fVar21 + 2.0 + fVar2 * 0.5;
  if (pIVar9->ActiveId == id) {
    if ((pIVar9->IO).MouseDown[0] == true) {
      fVar19 = 0.0;
      if (0.0 < fVar22 - fVar2) {
        fVar22 = (*(float *)((pIVar9->IO).MouseDown + (ulong)uVar16 * 4 + -8) - fVar21) /
                 (fVar22 - fVar2);
        fVar19 = 1.0;
        if (fVar22 <= 1.0) {
          fVar19 = fVar22;
        }
        fVar19 = (float)(~-(uint)(fVar22 < 0.0) & (uint)fVar19);
      }
      if (uVar16 != 0) {
        fVar19 = 1.0 - fVar19;
      }
      if (0.99999 <= power && power <= 1.00001) {
        fVar22 = (v_max - v_min) * fVar19 + v_min;
      }
      else {
        if (fVar18 <= fVar19) {
          uVar17 = -(uint)(1e-06 < ABS(fVar18 + -1.0));
          fVar20 = powf((float)(~uVar17 & (uint)fVar19 |
                               (uint)((fVar19 - fVar18) / (1.0 - fVar18)) & uVar17),power);
          fVar22 = (float)(-(uint)(0.0 <= v_min) & (uint)v_min);
          fVar19 = v_max;
        }
        else {
          fVar20 = powf(1.0 - fVar19 / fVar18,power);
          fVar22 = v_max;
          fVar19 = v_min;
          if (0.0 <= v_max) {
            fVar22 = 0.0;
          }
        }
        fVar22 = (fVar19 - fVar22) * fVar20 + fVar22;
      }
      fVar22 = RoundScalar(fVar22,decimal_precision);
      if ((*v != fVar22) || (NAN(*v) || NAN(fVar22))) {
        *v = fVar22;
        bVar15 = true;
      }
      else {
        bVar15 = false;
      }
      goto LAB_0016ac45;
    }
    GImGui->ActiveIdIsJustActivated = GImGui->ActiveId != 0;
    pIVar10->ActiveId = 0;
    pIVar10->ActiveIdAllowOverlap = false;
    pIVar10->ActiveIdWindow = (ImGuiWindow *)0x0;
  }
  bVar15 = false;
LAB_0016ac45:
  fVar22 = 0.0;
  if ((v_min != v_max) || (NAN(v_min) || NAN(v_max))) {
    fVar22 = *v;
    fVar20 = v_max;
    fVar19 = v_min;
    if (v_max <= v_min) {
      fVar20 = v_min;
      fVar19 = v_max;
    }
    if (fVar22 <= fVar20) {
      fVar20 = fVar22;
    }
    fVar22 = (float)(~-(uint)(fVar22 < fVar19) & (uint)fVar20 |
                    (uint)fVar19 & -(uint)(fVar22 < fVar19));
    if (0.99999 <= power && power <= 1.00001) {
      fVar22 = (fVar22 - v_min) / (v_max - v_min);
    }
    else if (0.0 <= fVar22) {
      fVar19 = (float)(~-(uint)(v_min <= 0.0) & (uint)v_min);
      fVar22 = powf((fVar22 - fVar19) / (v_max - fVar19),1.0 / power);
      fVar22 = (1.0 - fVar18) * fVar22 + fVar18;
    }
    else {
      fVar19 = 0.0;
      if (v_max <= 0.0) {
        fVar19 = v_max;
      }
      fVar22 = powf(1.0 - (fVar22 - v_min) / (fVar19 - v_min),1.0 / power);
      fVar22 = fVar18 * (1.0 - fVar22);
    }
  }
  if (uVar16 != 0) {
    fVar22 = 1.0 - fVar22;
  }
  fVar21 = (((fVar3 + -2.0) - fVar2 * 0.5) - fVar21) * fVar22 + fVar21;
  if (uVar16 != 0) {
    local_40.x = (frame_bb->Min).x + 2.0;
    local_38.x = (frame_bb->Max).x + -2.0;
    local_40.y = -fVar2 * 0.5 + fVar21;
    local_38.y = fVar2 * 0.5 + fVar21;
  }
  else {
    local_40.x = -fVar2 * 0.5 + fVar21;
    local_38.x = fVar2 * 0.5 + fVar21;
    local_40.y = (frame_bb->Min).y + 2.0;
    local_38.y = (frame_bb->Max).y + -2.0;
  }
  this = pIVar4->DrawList;
  pIVar1 = (GImGui->Style).Colors + (ulong)(pIVar9->ActiveId == id) + 0x14;
  local_58.x = pIVar1->x;
  local_58.y = pIVar1->y;
  uVar7 = pIVar1->z;
  uVar8 = pIVar1->w;
  local_58.w = (GImGui->Style).Alpha * (float)uVar8;
  local_58.z = (float)uVar7;
  IVar11 = ColorConvertFloat4ToU32(&local_58);
  ImDrawList::AddRectFilled(this,&local_40,&local_38,IVar11,(pIVar9->Style).GrabRounding,-1);
  return bVar15;
}

Assistant:

bool ImGui::SliderBehavior(const ImRect& frame_bb, ImGuiID id, float* v, float v_min, float v_max, float power, int decimal_precision, ImGuiSliderFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    const ImGuiStyle& style = g.Style;

    // Draw frame
    RenderFrame(frame_bb.Min, frame_bb.Max, GetColorU32(ImGuiCol_FrameBg), true, style.FrameRounding);

    const bool is_non_linear = (power < 1.0f-0.00001f) || (power > 1.0f+0.00001f);
    const bool is_horizontal = (flags & ImGuiSliderFlags_Vertical) == 0;

    const float grab_padding = 2.0f;
    const float slider_sz = is_horizontal ? (frame_bb.GetWidth() - grab_padding * 2.0f) : (frame_bb.GetHeight() - grab_padding * 2.0f);
    float grab_sz;
    if (decimal_precision != 0)
        grab_sz = ImMin(style.GrabMinSize, slider_sz);
    else
        grab_sz = ImMin(ImMax(1.0f * (slider_sz / ((v_min < v_max ? v_max - v_min : v_min - v_max) + 1.0f)), style.GrabMinSize), slider_sz);  // Integer sliders, if possible have the grab size represent 1 unit
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = (is_horizontal ? frame_bb.Min.x : frame_bb.Min.y) + grab_padding + grab_sz*0.5f;
    const float slider_usable_pos_max = (is_horizontal ? frame_bb.Max.x : frame_bb.Max.y) - grab_padding - grab_sz*0.5f;

    // For logarithmic sliders that cross over sign boundary we want the exponential increase to be symmetric around 0.0f
    float linear_zero_pos = 0.0f;   // 0.0->1.0f
    if (v_min * v_max < 0.0f)
    {
        // Different sign
        const float linear_dist_min_to_0 = powf(fabsf(0.0f - v_min), 1.0f/power);
        const float linear_dist_max_to_0 = powf(fabsf(v_max - 0.0f), 1.0f/power);
        linear_zero_pos = linear_dist_min_to_0 / (linear_dist_min_to_0+linear_dist_max_to_0);
    }
    else
    {
        // Same sign
        linear_zero_pos = v_min < 0.0f ? 1.0f : 0.0f;
    }

    // Process clicking on the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.IO.MouseDown[0])
        {
            const float mouse_abs_pos = is_horizontal ? g.IO.MousePos.x : g.IO.MousePos.y;
            clicked_t = (slider_usable_sz > 0.0f) ? ImClamp((mouse_abs_pos - slider_usable_pos_min) / slider_usable_sz, 0.0f, 1.0f) : 0.0f;
            if (!is_horizontal)
                clicked_t = 1.0f - clicked_t;
            set_new_value = true;
        }
        else
        {
            ClearActiveID();
        }

        if (set_new_value)
        {
            float new_value;
            if (is_non_linear)
            {
                // Account for logarithmic scale on both sides of the zero
                if (clicked_t < linear_zero_pos)
                {
                    // Negative: rescale to the negative range before powering
                    float a = 1.0f - (clicked_t / linear_zero_pos);
                    a = powf(a, power);
                    new_value = ImLerp(ImMin(v_max,0.0f), v_min, a);
                }
                else
                {
                    // Positive: rescale to the positive range before powering
                    float a;
                    if (fabsf(linear_zero_pos - 1.0f) > 1.e-6f)
                        a = (clicked_t - linear_zero_pos) / (1.0f - linear_zero_pos);
                    else
                        a = clicked_t;
                    a = powf(a, power);
                    new_value = ImLerp(ImMax(v_min,0.0f), v_max, a);
                }
            }
            else
            {
                // Linear slider
                new_value = ImLerp(v_min, v_max, clicked_t);
            }

            // Round past decimal precision
            new_value = RoundScalar(new_value, decimal_precision);
            if (*v != new_value)
            {
                *v = new_value;
                value_changed = true;
            }
        }
    }

    // Draw
    float grab_t = SliderBehaviorCalcRatioFromValue(*v, v_min, v_max, power, linear_zero_pos);
    if (!is_horizontal)
        grab_t = 1.0f - grab_t;
    const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
    ImRect grab_bb;
    if (is_horizontal)
        grab_bb = ImRect(ImVec2(grab_pos - grab_sz*0.5f, frame_bb.Min.y + grab_padding), ImVec2(grab_pos + grab_sz*0.5f, frame_bb.Max.y - grab_padding));
    else
        grab_bb = ImRect(ImVec2(frame_bb.Min.x + grab_padding, grab_pos - grab_sz*0.5f), ImVec2(frame_bb.Max.x - grab_padding, grab_pos + grab_sz*0.5f));
    window->DrawList->AddRectFilled(grab_bb.Min, grab_bb.Max, GetColorU32(g.ActiveId == id ? ImGuiCol_SliderGrabActive : ImGuiCol_SliderGrab), style.GrabRounding);

    return value_changed;
}